

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int nh_ws_handshake(http_context_t *ctx)

{
  char *__src;
  int iVar1;
  void *ptr;
  uchar *dest;
  http_string_t hVar2;
  char *result;
  uchar sha1_encoded [21];
  uchar local_c8 [8];
  char raw [61];
  size_t local_80;
  http_string_t key;
  http_context_t *ctx_local;
  
  if (ctx->version != HTTP_1_0) {
    hVar2 = get_request_method(ctx);
    iVar1 = string_cmp_chars_case_insensitive(hVar2,"GET");
    if (iVar1 != 0) {
      hVar2 = get_request_header(ctx,"Connection");
      iVar1 = string_cmp_chars_case_insensitive(hVar2,"upgrade");
      if (iVar1 != 0) {
        hVar2 = get_request_header(ctx,"Upgrade");
        iVar1 = string_cmp_chars_case_insensitive(hVar2,"websocket");
        if (iVar1 != 0) {
          hVar2 = get_request_header(ctx,"Sec-WebSocket-Version");
          iVar1 = string_cmp_chars_case_insensitive(hVar2,"13");
          if (iVar1 != 0) {
            join_0x00000010_0x00000000_ = get_request_header(ctx,"Sec-WebSocket-Key");
            __src = stack0xffffffffffffff78;
            if (local_80 == 0x18) {
              ctx->session->flags = ctx->session->flags | 4;
              memset(local_c8,0,0x3d);
              memset(&result,0,0x15);
              strncpy((char *)local_c8,__src,0x18);
              strcpy(raw + 0x10,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
              SHA1(local_c8,0x3c,(uchar *)&result);
              ptr = malloc(0x1f);
              dest = (uchar *)bind_with_context(ctx,ptr);
              nh_base64_encode((uchar *)&result,0x14,dest);
              set_response_status(ctx,0x65);
              set_response_header(ctx,"Upgrade","websocket");
              set_response_header(ctx,"Connection","Upgrade");
              set_response_header(ctx,"Sec-WebSocket-Accept",(char *)dest);
              nh_stream_init(&(ctx->response).raw);
              nh_generate_http_response(ctx);
              nh_session_write(ctx->session);
              return 1;
            }
          }
        }
      }
    }
  }
  set_response_status(ctx,400);
  return 0;
}

Assistant:

int nh_ws_handshake(http_context_t *ctx) {
    http_string_t key;
    if (ctx->version == HTTP_1_0
        || !string_cmp_chars_case_insensitive(get_request_method(ctx), "GET")
        || !string_cmp_chars_case_insensitive(get_request_header(ctx, "Connection"), "upgrade")
        || !string_cmp_chars_case_insensitive(get_request_header(ctx, "Upgrade"), "websocket")
        || !string_cmp_chars_case_insensitive(get_request_header(ctx, "Sec-WebSocket-Version"), "13")
        // skip check about Sec-WebSocket-Protocol and Sec-WebSocket-Extension
        // base64(16bit) = 24bit
        || (key = get_request_header(ctx, "Sec-WebSocket-Key")).len != 24) {
        set_response_status(ctx, 400);
        return 0;
    }

    // set flag upgraded
    FLAG_SET(ctx->session->flags, SESSION_FLAG_UPGRADED);
    char raw[61] = {0};
    unsigned char sha1_encoded[SHA_DIGEST_LENGTH + 1] = {0};
    strncpy(raw, key.value, 24);
    strcpy(&raw[24], WEBSOCKET_MAGIC_NUMBER);
    SHA1((unsigned char const *) raw, 60, (unsigned char *) sha1_encoded);
    char *result = (char *) bind_with_context(ctx, malloc(sizeof(char) * 31));
    nh_base64_encode(sha1_encoded, SHA_DIGEST_LENGTH, (unsigned char *) result);
    set_response_status(ctx, 101);
    set_response_header(ctx, "Upgrade", "websocket");
    set_response_header(ctx, "Connection", "Upgrade");
    set_response_header(ctx, "Sec-WebSocket-Accept", result);

    nh_stream_init(&ctx->response.raw);
    nh_generate_http_response(ctx);
    nh_session_write(ctx->session);

    return 1;
}